

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_kernel_2.h
# Opt level: O0

void __thiscall
dlib::queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::enqueue
          (queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>
           *this,directory *item)

{
  node *pnVar1;
  directory *in_RSI;
  directory *in_RDI;
  memory_manager_stateless_kernel_1<dlib::queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::node>
  *unaff_retaddr;
  
  if (*(long *)&(in_RDI->state).field_0x28 == 0) {
    pnVar1 = memory_manager_stateless_kernel_1<dlib::queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::node>
             ::allocate(unaff_retaddr);
    *(node **)&(in_RDI->state).field_0x18 = pnVar1;
    *(node **)&(in_RDI->state).full_name = pnVar1;
    *(undefined8 *)&(in_RDI->state).field_0x30 = 0;
    *(undefined8 *)&(in_RDI->state).field_0x38 = 0;
  }
  else if (0x13 < *(ulong *)&(in_RDI->state).field_0x30) {
    pnVar1 = memory_manager_stateless_kernel_1<dlib::queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::node>
             ::allocate(unaff_retaddr);
    **(undefined8 **)&(in_RDI->state).field_0x18 = pnVar1;
    *(undefined8 *)&(in_RDI->state).field_0x30 = 0;
    *(undefined8 *)&(in_RDI->state).field_0x18 = **(undefined8 **)&(in_RDI->state).field_0x18;
  }
  exchange<dlib::directory>(in_RSI,in_RDI);
  *(long *)&(in_RDI->state).field_0x30 = *(long *)&(in_RDI->state).field_0x30 + 1;
  *(long *)&(in_RDI->state).field_0x28 = *(long *)&(in_RDI->state).field_0x28 + 1;
  (**(code **)(*(long *)&in_RDI->state + 0x18))();
  return;
}

Assistant:

void queue_kernel_2<T,block_size,mem_manager>::
    enqueue (
        T& item
    )
    {
        if (queue_size == 0)
        {
            out = in = pool.allocate();
            in_pos = 0;
            out_pos = 0;
        }
        else if (in_pos >= block_size)
        {            
            in->next = pool.allocate();
            in_pos = 0;
            in = in->next;
        }

        exchange(item,in->item[in_pos]);
        ++in_pos;

        ++queue_size;

        // put the enumerator at the start
        reset();
    }